

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetInterfaceForStage_abi_cxx11_
          (string *__return_storage_ptr__,ProgramInterface *this,STAGES stage)

{
  ShaderInterface *this_00;
  PtrVector *vector;
  size_t position;
  size_t local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  GLchar *local_40 [4];
  
  local_e8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "/* Globals */\nGLOBALS\n\n/* Structures */\nSTRUCTURES\n\n/* Uniforms */\nUNIFORMS\n\n/* Inputs */\nINPUTS\n\n/* Outputs */\nOUTPUTS\n\n/* Storage */\nSTORAGE\n"
             ,(allocator<char> *)&local_e0);
  this_00 = GetShaderInterface(this,stage);
  GetDefinitions_abi_cxx11_(&local_e0,(Utils *)this,vector);
  std::__cxx11::string::string((string *)local_40,(string *)this_00);
  ShaderInterface::GetDefinitionsInputs_abi_cxx11_(&local_60,this_00);
  ShaderInterface::GetDefinitionsOutputs_abi_cxx11_(&local_80,this_00);
  ShaderInterface::GetDefinitionsUniforms_abi_cxx11_(&local_a0,this_00);
  ShaderInterface::GetDefinitionsSSBs_abi_cxx11_(&local_c0,this_00);
  replaceToken("GLOBALS",&local_e8,local_40[0],__return_storage_ptr__);
  replaceToken("STRUCTURES",&local_e8,local_e0._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("UNIFORMS",&local_e8,local_a0._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("INPUTS",&local_e8,local_60._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("OUTPUTS",&local_e8,local_80._M_dataplus._M_p,__return_storage_ptr__);
  replaceToken("STORAGE",&local_e8,local_c0._M_dataplus._M_p,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::string ProgramInterface::GetInterfaceForStage(Shader::STAGES stage) const
{
	size_t		position  = 0;
	std::string interface = "/* Globals */\n"
							"GLOBALS\n"
							"\n"
							"/* Structures */\n"
							"STRUCTURES\n"
							"\n"
							"/* Uniforms */\n"
							"UNIFORMS\n"
							"\n"
							"/* Inputs */\n"
							"INPUTS\n"
							"\n"
							"/* Outputs */\n"
							"OUTPUTS\n"
							"\n"
							"/* Storage */\n"
							"STORAGE\n";

	const ShaderInterface& si = GetShaderInterface(stage);

	const std::string& structures = GetDefinitionsStructures();

	const std::string& globals  = si.GetDefinitionsGlobals();
	const std::string& inputs   = si.GetDefinitionsInputs();
	const std::string& outputs  = si.GetDefinitionsOutputs();
	const std::string& uniforms = si.GetDefinitionsUniforms();
	const std::string& ssbs		= si.GetDefinitionsSSBs();

	replaceToken("GLOBALS", position, globals.c_str(), interface);
	replaceToken("STRUCTURES", position, structures.c_str(), interface);
	replaceToken("UNIFORMS", position, uniforms.c_str(), interface);
	replaceToken("INPUTS", position, inputs.c_str(), interface);
	replaceToken("OUTPUTS", position, outputs.c_str(), interface);
	replaceToken("STORAGE", position, ssbs.c_str(), interface);

	return interface;
}